

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O1

int64_t GmfStatKwd(int64_t MshIdx,int KwdCod,...)

{
  int iVar1;
  long lVar2;
  undefined4 *in_RDX;
  long lVar3;
  undefined4 *in_R9;
  va_list VarArg;
  undefined4 *local_a0;
  long local_98;
  
  if (0xffffff0f < KwdCod - 0xf1U) {
    lVar2 = (ulong)(uint)KwdCod * 0x3300;
    if (*(long *)(MshIdx + 0x10d8 + lVar2) != 0) {
      lVar2 = MshIdx + lVar2;
      if (*(int *)(lVar2 + 0x110) == 3) {
        *in_RDX = *(undefined4 *)(lVar2 + 0x124);
        *local_a0 = *(undefined4 *)(lVar2 + 0x11c);
        if (0 < *(int *)(lVar2 + 0x124)) {
          lVar3 = 0;
          do {
            *(undefined4 *)(local_98 + lVar3 * 4) = *(undefined4 *)(lVar2 + 0x128 + lVar3 * 4);
            lVar3 = lVar3 + 1;
          } while (lVar3 < *(int *)(lVar2 + 0x124));
        }
        iVar1 = strcmp("hr",GmfKwdFmt[(uint)KwdCod][2]);
        if (iVar1 == 0) {
          *in_R9 = *(undefined4 *)(lVar2 + 0x114);
          *(undefined4 *)VarArg[0].overflow_arg_area = *(undefined4 *)(lVar2 + 0x118);
        }
      }
      return *(int64_t *)(lVar2 + 0x10d8);
    }
  }
  return 0;
}

Assistant:

int64_t GmfStatKwd(int64_t MshIdx, int KwdCod, ...)
{
   int         i, *PtrNmbTyp, *PtrSolSiz, *TypTab, *PtrDeg, *PtrNmbNod;
   GmfMshSct   *msh = (GmfMshSct *)MshIdx;
   KwdSct      *kwd;
   va_list     VarArg;

   if( (KwdCod < 1) || (KwdCod > GmfMaxKwd) )
      return(0);

   kwd = &msh->KwdTab[ KwdCod ];

   if(!kwd->NmbLin)
      return(0);

   // Read further arguments if this kw is a sol
   if(kwd->typ == SolKwd)
   {
      va_start(VarArg, KwdCod);

      PtrNmbTyp = va_arg(VarArg, int *);
      *PtrNmbTyp = kwd->NmbTyp;

      PtrSolSiz = va_arg(VarArg, int *);
      *PtrSolSiz = kwd->SolSiz;

      TypTab = va_arg(VarArg, int *);

      for(i=0;i<kwd->NmbTyp;i++)
         TypTab[i] = kwd->TypTab[i];

      // Add two extra paramaters for HO elements: degree and nmb nodes
      if(!strcmp("hr", GmfKwdFmt[ KwdCod ][2]) )
      {
         PtrDeg = va_arg(VarArg, int *);
         *PtrDeg = kwd->deg;
         
         PtrNmbNod = va_arg(VarArg, int *);
         *PtrNmbNod = kwd->NmbNod;
      }

      va_end(VarArg);
   }

   return(kwd->NmbLin);
}